

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O3

BitState __thiscall I2sSimulationDataGenerator::GetNextAudioBit(I2sSimulationDataGenerator *this)

{
  PcmBitAlignment PVar1;
  I2sAnalyzerSettings *pIVar2;
  pointer plVar3;
  pointer plVar4;
  longlong lVar5;
  ulong uVar6;
  uint uVar7;
  U32 UVar8;
  U32 UVar9;
  RightLeftDirection RVar10;
  BitGenerarionState BVar11;
  
  BVar11 = this->mBitGenerationState;
  pIVar2 = this->mSettings;
  plVar3 = (this->mSineWaveSamplesLeft).super__Vector_base<long_long,_std::allocator<long_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar4 = (this->mSineWaveSamplesLeft).super__Vector_base<long_long,_std::allocator<long_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  UVar8 = this->mPaddingCount;
  uVar7 = this->mCurrentBitIndex;
  RVar10 = this->mCurrentAudioChannel;
  UVar9 = this->mCurrentAudioWordIndex;
LAB_00108fda:
  switch(BVar11) {
  case Init:
    goto switchD_00108fee_caseD_0;
  case LeftPadding:
    if (pIVar2->mWordAlignment != RIGHT_ALIGNED) {
      this->mBitGenerationState = Data;
      BVar11 = Data;
      goto LAB_00108fda;
    }
    break;
  case Data:
    if (uVar7 != pIVar2->mBitsPerWord) {
      uVar6 = (this->mBitMasks).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      this->mCurrentBitIndex = uVar7 + 1;
      return (uint)((this->mCurrentWord & uVar6) != 0);
    }
    this->mCurrentBitIndex = 0;
    uVar7 = 0;
    lVar5 = plVar3[UVar9];
    if (RVar10 == Left) {
      RVar10 = Right;
    }
    else {
      UVar9 = UVar9 + 1;
      if ((ulong)((long)plVar4 - (long)plVar3 >> 3) <= (ulong)UVar9) {
        UVar9 = 0;
      }
      this->mCurrentAudioWordIndex = UVar9;
      RVar10 = Left;
    }
    this->mCurrentAudioChannel = RVar10;
    this->mCurrentWord = lVar5;
    this->mBitGenerationState = RightPadding;
    BVar11 = RightPadding;
    goto LAB_00108fda;
  case RightPadding:
    if (pIVar2->mWordAlignment != LEFT_ALIGNED) {
      this->mBitGenerationState = LeftPadding;
      BVar11 = LeftPadding;
      goto LAB_00108fda;
    }
    break;
  default:
    AnalyzerHelpers::Assert("unexpected");
    return BIT_LOW;
  }
  if (UVar8 < this->mNumPaddingBits) {
    this->mPaddingCount = UVar8 + 1;
    return BIT_LOW;
  }
  this->mPaddingCount = 0;
  this->mBitGenerationState = Data;
  BVar11 = Data;
  UVar8 = 0;
  goto LAB_00108fda;
switchD_00108fee_caseD_0:
  PVar1 = pIVar2->mBitAlignment;
  this->mBitGenerationState = LeftPadding;
  BVar11 = LeftPadding;
  if (PVar1 == BITS_SHIFTED_RIGHT_1) {
    return BIT_LOW;
  }
  goto LAB_00108fda;
}

Assistant:

BitState I2sSimulationDataGenerator::GetNextAudioBit()
{
    switch( mBitGenerationState )
    {
    case Init:
        if( mSettings->mBitAlignment == BITS_SHIFTED_RIGHT_1 )
        {
            mBitGenerationState = LeftPadding;
            return BIT_LOW; // just once, we'll insert a 1-bit offset.
        }
        else
        {
            mBitGenerationState = LeftPadding;
            return GetNextAudioBit();
        }
        break;
    case LeftPadding:
        if( mSettings->mWordAlignment == RIGHT_ALIGNED )
        {
            if( mPaddingCount < mNumPaddingBits )
            {
                mPaddingCount++;
                return BIT_LOW;
            }
            else
            {
                mBitGenerationState = Data;
                mPaddingCount = 0;
                return GetNextAudioBit();
            }
        }
        else
        {
            mBitGenerationState = Data;
            return GetNextAudioBit();
        }
        break;
    case Data:
        if( mCurrentBitIndex == mSettings->mBitsPerWord )
        {
            mCurrentBitIndex = 0;
            mCurrentWord = GetNextAudioWord();
            mBitGenerationState = RightPadding;
            return GetNextAudioBit();
        }
        else
        {
            BitState bit_state;

            if( ( mCurrentWord & mBitMasks[ mCurrentBitIndex ] ) == 0 )
                bit_state = BIT_LOW;
            else
                bit_state = BIT_HIGH;

            mCurrentBitIndex++;
            return bit_state;
        }
        break;
    case RightPadding:
        if( mSettings->mWordAlignment == LEFT_ALIGNED )
        {
            if( mPaddingCount < mNumPaddingBits )
            {
                mPaddingCount++;
                return BIT_LOW;
            }
            else
            {
                mBitGenerationState = Data;
                mPaddingCount = 0;
                return GetNextAudioBit();
            }
        }
        else
        {
            mBitGenerationState = LeftPadding;
            return GetNextAudioBit();
        }
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        return BIT_LOW; // eliminate warning
        break;
    }
}